

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

bool __thiscall
vkb::PhysicalDevice::enable_features_if_present
          (PhysicalDevice *this,VkPhysicalDeviceFeatures *features_to_enable)

{
  VkPhysicalDeviceFeatures src;
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  VkPhysicalDeviceFeatures actual_pdf;
  undefined1 in_stack_fffffffffffffd08 [216];
  GenericFeatureChain local_218;
  GenericFeatureChain local_1f8;
  undefined8 local_1e0 [27];
  VkBool32 local_108;
  VkPhysicalDeviceFeatures local_104;
  
  bVar5 = 0;
  memset(&local_104,0,0xdc);
  (*(code *)detail::vulkan_functions()::v._128_8_)(this->physical_device,&local_104);
  local_1f8.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = detail::supports_features(&local_104,features_to_enable,&local_1f8,&local_218);
  if (bVar1) {
    memcpy(local_1e0,features_to_enable,0xdc);
    puVar3 = local_1e0;
    puVar4 = (undefined8 *)&stack0xfffffffffffffd08;
    for (lVar2 = 0x1b; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    src.inheritedQueries = local_108;
    src.robustBufferAccess = in_stack_fffffffffffffd08._0_4_;
    src.fullDrawIndexUint32 = in_stack_fffffffffffffd08._4_4_;
    src.imageCubeArray = in_stack_fffffffffffffd08._8_4_;
    src.independentBlend = in_stack_fffffffffffffd08._12_4_;
    src.geometryShader = in_stack_fffffffffffffd08._16_4_;
    src.tessellationShader = in_stack_fffffffffffffd08._20_4_;
    src.sampleRateShading = in_stack_fffffffffffffd08._24_4_;
    src.dualSrcBlend = in_stack_fffffffffffffd08._28_4_;
    src.logicOp = in_stack_fffffffffffffd08._32_4_;
    src.multiDrawIndirect = in_stack_fffffffffffffd08._36_4_;
    src.drawIndirectFirstInstance = in_stack_fffffffffffffd08._40_4_;
    src.depthClamp = in_stack_fffffffffffffd08._44_4_;
    src.depthBiasClamp = in_stack_fffffffffffffd08._48_4_;
    src.fillModeNonSolid = in_stack_fffffffffffffd08._52_4_;
    src.depthBounds = in_stack_fffffffffffffd08._56_4_;
    src.wideLines = in_stack_fffffffffffffd08._60_4_;
    src.largePoints = in_stack_fffffffffffffd08._64_4_;
    src.alphaToOne = in_stack_fffffffffffffd08._68_4_;
    src.multiViewport = in_stack_fffffffffffffd08._72_4_;
    src.samplerAnisotropy = in_stack_fffffffffffffd08._76_4_;
    src.textureCompressionETC2 = in_stack_fffffffffffffd08._80_4_;
    src.textureCompressionASTC_LDR = in_stack_fffffffffffffd08._84_4_;
    src.textureCompressionBC = in_stack_fffffffffffffd08._88_4_;
    src.occlusionQueryPrecise = in_stack_fffffffffffffd08._92_4_;
    src.pipelineStatisticsQuery = in_stack_fffffffffffffd08._96_4_;
    src.vertexPipelineStoresAndAtomics = in_stack_fffffffffffffd08._100_4_;
    src.fragmentStoresAndAtomics = in_stack_fffffffffffffd08._104_4_;
    src.shaderTessellationAndGeometryPointSize = in_stack_fffffffffffffd08._108_4_;
    src.shaderImageGatherExtended = in_stack_fffffffffffffd08._112_4_;
    src.shaderStorageImageExtendedFormats = in_stack_fffffffffffffd08._116_4_;
    src.shaderStorageImageMultisample = in_stack_fffffffffffffd08._120_4_;
    src.shaderStorageImageReadWithoutFormat = in_stack_fffffffffffffd08._124_4_;
    src.shaderStorageImageWriteWithoutFormat = in_stack_fffffffffffffd08._128_4_;
    src.shaderUniformBufferArrayDynamicIndexing = in_stack_fffffffffffffd08._132_4_;
    src.shaderSampledImageArrayDynamicIndexing = in_stack_fffffffffffffd08._136_4_;
    src.shaderStorageBufferArrayDynamicIndexing = in_stack_fffffffffffffd08._140_4_;
    src.shaderStorageImageArrayDynamicIndexing = in_stack_fffffffffffffd08._144_4_;
    src.shaderClipDistance = in_stack_fffffffffffffd08._148_4_;
    src.shaderCullDistance = in_stack_fffffffffffffd08._152_4_;
    src.shaderFloat64 = in_stack_fffffffffffffd08._156_4_;
    src.shaderInt64 = in_stack_fffffffffffffd08._160_4_;
    src.shaderInt16 = in_stack_fffffffffffffd08._164_4_;
    src.shaderResourceResidency = in_stack_fffffffffffffd08._168_4_;
    src.shaderResourceMinLod = in_stack_fffffffffffffd08._172_4_;
    src.sparseBinding = in_stack_fffffffffffffd08._176_4_;
    src.sparseResidencyBuffer = in_stack_fffffffffffffd08._180_4_;
    src.sparseResidencyImage2D = in_stack_fffffffffffffd08._184_4_;
    src.sparseResidencyImage3D = in_stack_fffffffffffffd08._188_4_;
    src.sparseResidency2Samples = in_stack_fffffffffffffd08._192_4_;
    src.sparseResidency4Samples = in_stack_fffffffffffffd08._196_4_;
    src.sparseResidency8Samples = in_stack_fffffffffffffd08._200_4_;
    src.sparseResidency16Samples = in_stack_fffffffffffffd08._204_4_;
    src.sparseResidencyAliased = in_stack_fffffffffffffd08._208_4_;
    src.variableMultisampleRate = in_stack_fffffffffffffd08._212_4_;
    detail::combine_features(&this->features,src);
  }
  return bVar1;
}

Assistant:

bool PhysicalDevice::enable_features_if_present(const VkPhysicalDeviceFeatures& features_to_enable) {
    VkPhysicalDeviceFeatures actual_pdf{};
    detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures(physical_device, &actual_pdf);

    bool required_features_supported = detail::supports_features(actual_pdf, features_to_enable, {}, {});
    if (required_features_supported) {
        detail::combine_features(features, features_to_enable);
    }
    return required_features_supported;
}